

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_management.c
# Opt level: O1

int amqp_management_open_async
              (AMQP_MANAGEMENT_HANDLE amqp_management,
              ON_AMQP_MANAGEMENT_OPEN_COMPLETE on_amqp_management_open_complete,
              void *on_amqp_management_open_complete_context,
              ON_AMQP_MANAGEMENT_ERROR on_amqp_management_error,
              void *on_amqp_management_error_context)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  
  if ((on_amqp_management_open_complete == (ON_AMQP_MANAGEMENT_OPEN_COMPLETE)0x0 ||
      amqp_management == (AMQP_MANAGEMENT_HANDLE)0x0) ||
      on_amqp_management_error == (ON_AMQP_MANAGEMENT_ERROR)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x3e0;
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_management.c"
                ,"amqp_management_open_async",0x3df,1,
                "Bad arguments: amqp_management = %p, on_amqp_management_open_complete = %p, on_amqp_management_error = %p"
                ,amqp_management,on_amqp_management_open_complete,on_amqp_management_error);
    }
  }
  else if (amqp_management->amqp_management_state == AMQP_MANAGEMENT_STATE_IDLE) {
    amqp_management->on_amqp_management_open_complete = on_amqp_management_open_complete;
    amqp_management->on_amqp_management_open_complete_context =
         on_amqp_management_open_complete_context;
    amqp_management->on_amqp_management_error = on_amqp_management_error;
    amqp_management->on_amqp_management_error_context = on_amqp_management_error_context;
    amqp_management->amqp_management_state = AMQP_MANAGEMENT_STATE_OPENING;
    iVar1 = messagereceiver_open
                      (amqp_management->message_receiver,on_message_received,amqp_management);
    if (iVar1 == 0) {
      iVar1 = messagesender_open(amqp_management->message_sender);
      if (iVar1 == 0) {
        iVar1 = 0;
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_management.c"
                    ,"amqp_management_open_async",0x3ff,1,"Failed opening message sender");
        }
        amqp_management->amqp_management_state = AMQP_MANAGEMENT_STATE_IDLE;
        messagereceiver_close(amqp_management->message_receiver);
        iVar1 = 0x402;
      }
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_management.c"
                  ,"amqp_management_open_async",0x3f5,1,"Failed opening message receiver");
      }
      amqp_management->amqp_management_state = AMQP_MANAGEMENT_STATE_IDLE;
      iVar1 = 0x3f7;
    }
  }
  else {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x3e6;
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_management.c"
                ,"amqp_management_open_async",0x3e5,1,"AMQP management instance already OPEN");
    }
  }
  return iVar1;
}

Assistant:

int amqp_management_open_async(AMQP_MANAGEMENT_HANDLE amqp_management, ON_AMQP_MANAGEMENT_OPEN_COMPLETE on_amqp_management_open_complete, void* on_amqp_management_open_complete_context, ON_AMQP_MANAGEMENT_ERROR on_amqp_management_error, void* on_amqp_management_error_context)
{
    int result;

    /* Codes_SRS_AMQP_MANAGEMENT_01_044: [ `on_amqp_management_open_complete_context` and `on_amqp_management_error_context` shall be allowed to be NULL. ]*/
    if ((amqp_management == NULL) ||
        (on_amqp_management_open_complete == NULL) ||
        (on_amqp_management_error == NULL))
    {
        /* Codes_SRS_AMQP_MANAGEMENT_01_038: [ If `amqp_management`, `on_amqp_management_open_complete` or `on_amqp_management_error` is NULL, `amqp_management_open_async` shall fail and return a non-zero value. ]*/
        LogError("Bad arguments: amqp_management = %p, on_amqp_management_open_complete = %p, on_amqp_management_error = %p",
            amqp_management,
            on_amqp_management_open_complete,
            on_amqp_management_error);
        result = MU_FAILURE;
    }
    else if (amqp_management->amqp_management_state != AMQP_MANAGEMENT_STATE_IDLE)
    {
        /* Codes_SRS_AMQP_MANAGEMENT_01_043: [ If the AMQP management instance is already OPEN or OPENING, `amqp_management_open_async` shall fail and return a non-zero value. ]*/
        LogError("AMQP management instance already OPEN");
        result = MU_FAILURE;
    }
    else
    {
        /* Codes_SRS_AMQP_MANAGEMENT_01_036: [ `amqp_management_open_async` shall start opening the AMQP management instance and save the callbacks so that they can be called when opening is complete. ]*/
        amqp_management->on_amqp_management_open_complete = on_amqp_management_open_complete;
        amqp_management->on_amqp_management_open_complete_context = on_amqp_management_open_complete_context;
        amqp_management->on_amqp_management_error = on_amqp_management_error;
        amqp_management->on_amqp_management_error_context = on_amqp_management_error_context;
        amqp_management->amqp_management_state = AMQP_MANAGEMENT_STATE_OPENING;

        /* Codes_SRS_AMQP_MANAGEMENT_01_040: [ `amqp_management_open_async` shall open the message receiver by calling `messagereceiver_open`. ]*/
        if (messagereceiver_open(amqp_management->message_receiver, on_message_received, amqp_management) != 0)
        {
            /* Codes_SRS_AMQP_MANAGEMENT_01_042: [ If `messagereceiver_open` fails, `amqp_management_open_async` shall fail and return a non-zero value. ]*/
            LogError("Failed opening message receiver");
            amqp_management->amqp_management_state = AMQP_MANAGEMENT_STATE_IDLE;
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_AMQP_MANAGEMENT_01_039: [ `amqp_management_open_async` shall open the message sender by calling `messagesender_open`. ]*/
            if (messagesender_open(amqp_management->message_sender) != 0)
            {
                /* Codes_SRS_AMQP_MANAGEMENT_01_041: [ If `messagesender_open` fails, `amqp_management_open_async` shall fail and return a non-zero value. ]*/
                LogError("Failed opening message sender");
                amqp_management->amqp_management_state = AMQP_MANAGEMENT_STATE_IDLE;
                (void)messagereceiver_close(amqp_management->message_receiver);
                result = MU_FAILURE;
            }
            else
            {
                /* Codes_SRS_AMQP_MANAGEMENT_01_037: [ On success it shall return 0. ]*/
                result = 0;
            }
        }
    }

    return result;
}